

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distance_calculation.cc
# Opt level: O2

bool __thiscall
sptk::DistanceCalculation::Run
          (DistanceCalculation *this,vector<double,_std::allocator<double>_> *vector1,
          vector<double,_std::allocator<double>_> *vector2,double *distance)

{
  double __x;
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  int m;
  long lVar5;
  int iVar6;
  long lVar7;
  int m_1;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (this->is_valid_ != true) {
    return false;
  }
  pdVar2 = (vector1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(vector1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  iVar6 = this->num_order_;
  lVar5 = (long)iVar6;
  if (lVar7 >> 3 == lVar5 + 1) {
    if (distance == (double *)0x0) {
      return false;
    }
    pdVar3 = (vector2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(vector2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pdVar3 != lVar7) {
      return false;
    }
    switch(this->distance_metric_) {
    case kManhattan:
      dVar10 = 0.0;
      for (lVar7 = 0; lVar7 <= lVar5; lVar7 = lVar7 + 1) {
        dVar10 = dVar10 + ABS(pdVar2[lVar7] - pdVar3[lVar7]);
      }
      break;
    case kEuclidean:
      dVar10 = 0.0;
      for (lVar7 = 0; lVar7 <= lVar5; lVar7 = lVar7 + 1) {
        dVar10 = dVar10 + (pdVar2[lVar7] - pdVar3[lVar7]) * (pdVar2[lVar7] - pdVar3[lVar7]);
      }
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      break;
    case kSquaredEuclidean:
      dVar10 = 0.0;
      for (lVar7 = 0; lVar7 <= lVar5; lVar7 = lVar7 + 1) {
        dVar10 = dVar10 + (pdVar2[lVar7] - pdVar3[lVar7]) * (pdVar2[lVar7] - pdVar3[lVar7]);
      }
      break;
    case kSymmetricKullbackLeibler:
      dVar10 = 0.0;
      for (lVar5 = 0; lVar5 <= iVar6; lVar5 = lVar5 + 1) {
        __x = pdVar2[lVar5];
        if ((__x <= 0.0) || (dVar1 = pdVar3[lVar5], dVar1 <= 0.0)) goto switchD_00103e92_default;
        dVar8 = log(__x);
        dVar9 = log(pdVar3[lVar5]);
        dVar10 = dVar10 + (dVar8 - dVar9) * (__x - dVar1);
        iVar6 = this->num_order_;
      }
      break;
    default:
      goto switchD_00103e92_default;
    }
    *distance = dVar10;
    bVar4 = true;
  }
  else {
switchD_00103e92_default:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool DistanceCalculation::Run(const std::vector<double>& vector1,
                              const std::vector<double>& vector2,
                              double* distance) const {
  // Check inputs.
  if (!is_valid_ ||
      vector1.size() != static_cast<std::size_t>(num_order_ + 1) ||
      vector2.size() != static_cast<std::size_t>(num_order_ + 1) ||
      NULL == distance) {
    return false;
  }

  const double* x(&(vector1[0]));
  const double* y(&(vector2[0]));

  double sum(0.0);

  switch (distance_metric_) {
    case kManhattan: {
      for (int m(0); m <= num_order_; ++m) {
        const double diff(x[m] - y[m]);
        sum += std::fabs(diff);
      }
      break;
    }
    case kEuclidean: {
      for (int m(0); m <= num_order_; ++m) {
        const double diff(x[m] - y[m]);
        sum += diff * diff;
      }
      sum = std::sqrt(sum);
      break;
    }
    case kSquaredEuclidean: {
      for (int m(0); m <= num_order_; ++m) {
        const double diff(x[m] - y[m]);
        sum += diff * diff;
      }
      break;
    }
    case kSymmetricKullbackLeibler: {
      for (int m(0); m <= num_order_; ++m) {
        if (x[m] <= 0.0 || y[m] <= 0.0) return false;
        const double diff(x[m] - y[m]);
        const double log_diff(std::log(x[m]) - std::log(y[m]));
        sum += diff * log_diff;
      }
      break;
    }
    default: {
      return false;
    }
  }

  *distance = sum;

  return true;
}